

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

Curl_multi * Curl_multi_handle(int hashsize,int chashsize)

{
  int iVar1;
  Curl_multi *pCVar2;
  
  pCVar2 = (Curl_multi *)(*Curl_ccalloc)(1,0x1e8);
  if (pCVar2 != (Curl_multi *)0x0) {
    pCVar2->type = 0xbab1e;
    iVar1 = Curl_mk_dnscache(&pCVar2->hostcache);
    if (((iVar1 == 0) &&
        (iVar1 = Curl_hash_init(&pCVar2->sockhash,hashsize,hash_fd,fd_key_compare,sh_freeentry),
        iVar1 == 0)) && (iVar1 = Curl_conncache_init(&pCVar2->conn_cache,chashsize), iVar1 == 0)) {
      Curl_llist_init(&pCVar2->msglist,multi_freeamsg);
      Curl_llist_init(&pCVar2->pending,multi_freeamsg);
      pCVar2->max_pipeline_length = 5;
      pCVar2->pipelining = 2;
      pCVar2->maxconnects = -1;
      return pCVar2;
    }
    Curl_hash_destroy(&pCVar2->sockhash);
    Curl_hash_destroy(&pCVar2->hostcache);
    Curl_conncache_destroy(&pCVar2->conn_cache);
    Curl_llist_destroy(&pCVar2->msglist,(void *)0x0);
    Curl_llist_destroy(&pCVar2->pending,(void *)0x0);
    (*Curl_cfree)(pCVar2);
  }
  return (Curl_multi *)0x0;
}

Assistant:

struct Curl_multi *Curl_multi_handle(int hashsize, /* socket hash */
                                     int chashsize) /* connection hash */
{
  struct Curl_multi *multi = calloc(1, sizeof(struct Curl_multi));

  if(!multi)
    return NULL;

  multi->type = CURL_MULTI_HANDLE;

  if(Curl_mk_dnscache(&multi->hostcache))
    goto error;

  if(sh_init(&multi->sockhash, hashsize))
    goto error;

  if(Curl_conncache_init(&multi->conn_cache, chashsize))
    goto error;

  Curl_llist_init(&multi->msglist, multi_freeamsg);
  Curl_llist_init(&multi->pending, multi_freeamsg);

  multi->max_pipeline_length = 5;
  multi->pipelining = CURLPIPE_MULTIPLEX;

  /* -1 means it not set by user, use the default value */
  multi->maxconnects = -1;
  return multi;

  error:

  Curl_hash_destroy(&multi->sockhash);
  Curl_hash_destroy(&multi->hostcache);
  Curl_conncache_destroy(&multi->conn_cache);
  Curl_llist_destroy(&multi->msglist, NULL);
  Curl_llist_destroy(&multi->pending, NULL);

  free(multi);
  return NULL;
}